

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  
  if (ptr == end) {
    return -1;
  }
  bVar1 = *ptr;
  iVar6 = 0;
  pcVar5 = ptr;
  iVar7 = iVar6;
  if (bVar1 < 0xdc) {
    if (bVar1 - 0xd8 < 4) {
LAB_004e2892:
      iVar7 = 0;
      if ((long)end - (long)ptr < 4) {
        return -2;
      }
      goto LAB_004e28af;
    }
    if (bVar1 == 0) {
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      if (bVar2 < 0x13) {
        if (bVar2 == 5) {
          if ((long)end - (long)ptr < 2) {
            return -2;
          }
          goto LAB_004e28af;
        }
        if (bVar2 == 6) {
          if ((long)end - (long)ptr < 3) {
            return -2;
          }
          goto LAB_004e28af;
        }
        if (bVar2 != 7) goto LAB_004e28af;
        goto LAB_004e2892;
      }
      if (bVar2 < 0x18) {
        if (bVar2 == 0x13) {
          pcVar5 = ptr + 2;
          if (pcVar5 == end) {
            return -1;
          }
          iVar7 = 0;
          if (*pcVar5 == '\0') {
            if ((ulong)(byte)ptr[3] == 0x78) {
              pcVar5 = ptr + 4;
              if (pcVar5 == end) {
                return -1;
              }
              iVar7 = iVar6;
              if ((*pcVar5 == '\0') &&
                 ((*(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[5]) & 0xfe) == 0x18)) {
                pcVar5 = ptr + 6;
                while( true ) {
                  if (pcVar5 == end) {
                    return -1;
                  }
                  if (*pcVar5 != '\0') goto LAB_004e28af;
                  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)pcVar5[1]);
                  if (1 < bVar1 - 0x18) break;
                  pcVar5 = pcVar5 + 2;
                }
                if (bVar1 == 0x12) {
                  pcVar5 = pcVar5 + 2;
                  iVar7 = 10;
                }
              }
            }
            else {
              iVar7 = iVar6;
              if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[3]) == '\x19') {
                pcVar4 = ptr + 4;
                do {
                  pcVar5 = pcVar4;
                  if (pcVar5 == end) {
                    return -1;
                  }
                  if (*pcVar5 != '\0') goto LAB_004e28af;
                  cVar3 = *(char *)((long)enc[1].scanners + (ulong)(byte)pcVar5[1]);
                  pcVar4 = pcVar5 + 2;
                } while (cVar3 == '\x19');
                if (cVar3 == '\x12') {
                  pcVar5 = pcVar5 + 2;
                  iVar7 = 10;
                }
              }
            }
          }
        }
        else if (bVar2 == 0x16) goto LAB_004e293c;
        goto LAB_004e28af;
      }
      if (bVar2 == 0x18) goto LAB_004e293c;
      if (bVar2 != 0x1d) goto LAB_004e28af;
    }
  }
  else if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)ptr[1])))) goto LAB_004e28af;
  if ((*(uint *)((long)namingBitmap +
                (ulong)((byte)ptr[1] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
       ((byte)ptr[1] & 0x1f) & 1) != 0) {
LAB_004e293c:
    if (ptr + 2 == end) {
      return -1;
    }
    lVar8 = (long)end - (long)ptr;
    pcVar5 = ptr + 4;
LAB_004e296c:
    lVar8 = lVar8 + -2;
    bVar1 = pcVar5[-2];
    if (0xdb < bVar1) {
      if (bVar1 == 0xff) {
        if ((byte)pcVar5[-1] < 0xfe) goto switchD_004e29a2_caseD_1d;
      }
      else if (3 < bVar1 - 0xdc) goto switchD_004e29a2_caseD_1d;
      goto switchD_004e29a2_caseD_8;
    }
    if (bVar1 != 0) {
      if (bVar1 - 0xd8 < 4) {
switchD_004e29a2_caseD_7:
        if (lVar8 < 4) {
          return -2;
        }
      }
      else {
switchD_004e29a2_caseD_1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)pcVar5[-1] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             ((byte)pcVar5[-1] & 0x1f) & 1) != 0) goto switchD_004e29a2_caseD_16;
      }
      goto switchD_004e29a2_caseD_8;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)pcVar5[-1])) {
    case 5:
      if (lVar8 < 2) {
        return -2;
      }
      break;
    case 6:
      if (lVar8 < 3) {
        return -2;
      }
      break;
    case 7:
      goto switchD_004e29a2_caseD_7;
    case 0x12:
      iVar7 = 9;
      goto LAB_004e28af;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_004e29a2_caseD_16;
    case 0x1d:
      goto switchD_004e29a2_caseD_1d;
    }
switchD_004e29a2_caseD_8:
    pcVar5 = pcVar5 + -2;
  }
LAB_004e28af:
  *nextTokPtr = pcVar5;
  return iVar7;
switchD_004e29a2_caseD_16:
  bVar9 = pcVar5 == end;
  pcVar5 = pcVar5 + 2;
  if (bVar9) {
    return -1;
  }
  goto LAB_004e296c;
}

Assistant:

static
int PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}